

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

string * __thiscall
SchemaConverter::_add_rule
          (string *__return_storage_ptr__,SchemaConverter *this,string *name,string *rule)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  size_t sVar1;
  long lVar2;
  string *__k;
  uint uVar3;
  int iVar4;
  uint __val;
  uint uVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  long *plVar8;
  ulong uVar9;
  size_type *psVar10;
  ulong uVar11;
  _Rb_tree_header *p_Var12;
  uint uVar13;
  bool bVar14;
  key_type local_d8;
  key_type local_b8;
  key_type local_98;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  string *local_38;
  
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  __first._M_current = (name->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            (&local_d8,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + name->_M_string_length),&INVALID_RULE_CHARS_RE_abi_cxx11_,"-",1
             ,0);
  this_00 = &this->_rules;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_d8);
  p_Var12 = &(this->_rules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node != p_Var12) {
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_d8);
    sVar1 = pmVar7->_M_string_length;
    if ((sVar1 != rule->_M_string_length) ||
       ((sVar1 != 0 &&
        (iVar4 = bcmp((pmVar7->_M_dataplus)._M_p,(rule->_M_dataplus)._M_p,sVar1), iVar4 != 0)))) {
      uVar13 = 0;
      local_38 = __return_storage_ptr__;
      do {
        __val = uVar13;
        uVar11 = (ulong)__val;
        uVar13 = 1;
        if (9 < __val) {
          uVar9 = uVar11;
          uVar3 = 4;
          do {
            uVar13 = uVar3;
            uVar5 = (uint)uVar9;
            if (uVar5 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001ffc24;
            }
            if (uVar5 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001ffc24;
            }
            if (uVar5 < 10000) goto LAB_001ffc24;
            uVar9 = uVar9 / 10000;
            uVar3 = uVar13 + 4;
          } while (99999 < uVar5);
          uVar13 = uVar13 + 1;
        }
LAB_001ffc24:
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar13);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58[0],uVar13,__val);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_58,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar10;
          local_b8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_b8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this_00->_M_t,&local_b8);
        if ((_Rb_tree_header *)iVar6._M_node == p_Var12) {
          bVar14 = false;
        }
        else {
          uVar13 = 1;
          if (9 < __val) {
            uVar9 = uVar11;
            uVar3 = 4;
            do {
              uVar13 = uVar3;
              uVar5 = (uint)uVar9;
              if (uVar5 < 100) {
                uVar13 = uVar13 - 2;
                goto LAB_001ffd1b;
              }
              if (uVar5 < 1000) {
                uVar13 = uVar13 - 1;
                goto LAB_001ffd1b;
              }
              if (uVar5 < 10000) goto LAB_001ffd1b;
              uVar9 = uVar9 / 10000;
              uVar3 = uVar13 + 4;
            } while (99999 < uVar5);
            uVar13 = uVar13 + 1;
          }
LAB_001ffd1b:
          local_78[0] = local_68;
          std::__cxx11::string::_M_construct((ulong)local_78,(char)uVar13);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78[0],uVar13,__val);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)local_78,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p
                                     );
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_98.field_2._M_allocated_capacity = *psVar10;
            local_98.field_2._8_8_ = plVar8[3];
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar10;
            local_98._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_98._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](this_00,&local_98);
          sVar1 = pmVar7->_M_string_length;
          bVar14 = true;
          if (sVar1 == rule->_M_string_length) {
            if (sVar1 == 0) {
              bVar14 = false;
            }
            else {
              iVar4 = bcmp((pmVar7->_M_dataplus)._M_p,(rule->_M_dataplus)._M_p,sVar1);
              bVar14 = iVar4 != 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        uVar13 = __val + 1;
      } while (bVar14);
      uVar13 = 1;
      if (9 < __val) {
        uVar3 = 4;
        do {
          uVar13 = uVar3;
          uVar5 = (uint)uVar11;
          if (uVar5 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_001fff33;
          }
          if (uVar5 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_001fff33;
          }
          if (uVar5 < 10000) goto LAB_001fff33;
          uVar11 = uVar11 / 10000;
          uVar3 = uVar13 + 4;
        } while (99999 < uVar5);
        uVar13 = uVar13 + 1;
      }
LAB_001fff33:
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar13);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_b8._M_dataplus._M_p,uVar13,__val);
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
      __k = local_38;
      (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        lVar2 = plVar8[3];
        (local_38->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&local_38->field_2 + 8) = lVar2;
      }
      else {
        (local_38->_M_dataplus)._M_p = (pointer)*plVar8;
        (local_38->field_2)._M_allocated_capacity = *psVar10;
      }
      local_38->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,__k);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        return __k;
      }
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
      return __k;
    }
  }
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_d8);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_d8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_d8._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::string _add_rule(const std::string & name, const std::string & rule) {
        std::string esc_name = regex_replace(name, INVALID_RULE_CHARS_RE, "-");
        if (_rules.find(esc_name) == _rules.end() || _rules[esc_name] == rule) {
            _rules[esc_name] = rule;
            return esc_name;
        } else {
            int i = 0;
            while (_rules.find(esc_name + std::to_string(i)) != _rules.end() && _rules[esc_name + std::to_string(i)] != rule) {
                i++;
            }
            std::string key = esc_name + std::to_string(i);
            _rules[key] = rule;
            return key;
        }
    }